

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O0

bool duckdb::CSVCast::TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,short>
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,uint8_t width,uint8_t scale,idx_t *line_error)

{
  anon_class_56_7_77d65c30 fun;
  undefined8 in_R8;
  idx_t cur_line;
  ValidityMask *validity_mask;
  bool all_converted;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 local_40;
  ValidityMask *local_38;
  VectorType local_2a;
  undefined8 local_28;
  
  local_2a = FSST_VECTOR;
  local_28 = in_R8;
  local_38 = FlatVector::Validity((Vector *)0x179ae6e);
  local_40 = 0;
  fun.width = (uint8_t *)local_38;
  fun.parameters = (CastParameters *)&local_40;
  fun.scale = (uint8_t *)in_stack_ffffffffffffff80;
  fun.all_converted = (bool *)local_28;
  fun.line_error = (idx_t *)&stack0xffffffffffffffd7;
  fun.cur_line = (idx_t *)&stack0x00000008;
  fun.validity_mask = (ValidityMask *)&stack0xffffffffffffffd6;
  UnaryExecutor::
  Execute<duckdb::string_t,short,duckdb::CSVCast::TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,short>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_char,unsigned_char,unsigned_long&)::_lambda(duckdb::string_t)_1_>
            ((Vector *)&stack0xffffffffffffffd6,(Vector *)&stack0x00000008,
             (idx_t)&stack0xffffffffffffffd7,fun,SUB81(local_28,7));
  return (bool)(local_2a & FSST_VECTOR);
}

Assistant:

static bool TemplatedTryCastDecimalVector(const CSVReaderOptions &options, Vector &input_vector,
	                                          Vector &result_vector, idx_t count, CastParameters &parameters,
	                                          uint8_t width, uint8_t scale, idx_t &line_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		auto &validity_mask = FlatVector::Validity(result_vector);
		idx_t cur_line = 0;
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(input, result, parameters, width, scale)) {
				if (all_converted) {
					line_error = cur_line;
				}
				validity_mask.SetInvalid(cur_line);
				all_converted = false;
				cur_line++;
			} else {
				cur_line++;
			}
			return result;
		});
		return all_converted;
	}